

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmCommon.cpp
# Opt level: O0

bool IsGlobalScope(ScopeData *scope)

{
  ScopeData *local_18;
  ScopeData *scope_local;
  
  if (scope == (ScopeData *)0x0) {
    scope_local._7_1_ = false;
  }
  else {
    local_18 = scope;
    if (scope->type == SCOPE_TEMPORARY) {
      scope_local._7_1_ = false;
    }
    else {
      for (; local_18->scope != (ScopeData *)0x0; local_18 = local_18->scope) {
        if (local_18->ownerFunction != (FunctionData *)0x0) {
          return false;
        }
        if (local_18->ownerType != (TypeBase *)0x0) {
          return false;
        }
      }
      scope_local._7_1_ = true;
    }
  }
  return scope_local._7_1_;
}

Assistant:

bool IsGlobalScope(ScopeData *scope)
{
	if(!scope)
		return false;

	if(scope->type == SCOPE_TEMPORARY)
		return false;

	while(scope->scope)
	{
		if(scope->ownerFunction)
			return false;

		if(scope->ownerType)
			return false;

		scope = scope->scope;
	}

	return true;
}